

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O0

void vkt::api::anon_unknown_0::genComputeSource(SourceCollections *programCollection)

{
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  string local_3f8;
  ShaderSource local_3d8;
  allocator<char> local_3a9;
  string local_3a8;
  ostringstream local_388 [8];
  ostringstream bufBad;
  string local_210;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream bufGood;
  char *versionDecl;
  SourceCollections *programCollection_local;
  
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"");
  poVar2 = std::operator<<(poVar2,
                           "layout(local_size_x = 1u, local_size_y = 1u, local_size_z = 1u) in;\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 1u, std140) uniform BufferName\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 colorA;\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 colorB;\n");
  poVar2 = std::operator<<(poVar2,"} b_instance;\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 0, std140) writeonly buffer OutBuf\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 read_colors[4];\n");
  poVar2 = std::operator<<(poVar2,"} b_out;\n");
  poVar2 = std::operator<<(poVar2,"void main(void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\thighp int quadrant_id = int(gl_WorkGroupID.x);\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 result_color;\n");
  poVar2 = std::operator<<(poVar2,"\tif (quadrant_id == 1 || quadrant_id == 2)\n");
  poVar2 = std::operator<<(poVar2,"\t\tresult_color = b_instance.colorA;\n");
  poVar2 = std::operator<<(poVar2,"\telse\n");
  poVar2 = std::operator<<(poVar2,"\t\tresult_color = b_instance.colorB;\n");
  poVar2 = std::operator<<(poVar2,"\tb_out.read_colors[gl_WorkGroupID.x] = result_color;\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"compute_good",&local_1c1)
  ;
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1c0);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_1f0,&local_210);
  glu::ProgramSources::operator<<(pPVar3,&local_1f0);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::ostringstream::ostringstream(local_388);
  poVar2 = std::operator<<((ostream *)local_388,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"");
  poVar2 = std::operator<<(poVar2,
                           "layout(local_size_x = 1u, local_size_y = 1u, local_size_z = 1u) in;\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 1u, std140) uniform BufferName\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 colorA;\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 colorB;\n");
  poVar2 = std::operator<<(poVar2,"} b_instance;\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 0, std140) writeonly buffer OutBuf\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 read_colors[4];\n");
  poVar2 = std::operator<<(poVar2,"} b_out;\n");
  poVar2 = std::operator<<(poVar2,"void main(void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\thighp int quadrant_id = int(gl_WorkGroupID.x);\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 result_color;\n");
  poVar2 = std::operator<<(poVar2,"\tif (quadrant_id == 1 || quadrant_id == 2)\n");
  poVar2 = std::operator<<(poVar2,"\t\tresult_color = b_instance.colorA;\n");
  poVar2 = std::operator<<(poVar2,"\telse\n");
  poVar2 = std::operator<<(poVar2,"\t\tresult_color = b_instance.colorB;\n");
  poVar2 = std::operator<<(poVar2,
                           "\tb_out.read_colors[gl_WorkGroupID.x] = vec4(0.0, 0.0, 0.0, 0.0);\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"compute_bad",&local_3a9);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_3a8);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_3d8,&local_3f8);
  glu::ProgramSources::operator<<(pPVar3,&local_3d8);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::__cxx11::ostringstream::~ostringstream(local_388);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void genComputeSource (SourceCollections& programCollection)
{
	const char* const						versionDecl				= glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	std::ostringstream						bufGood;

	bufGood << versionDecl << "\n"
	<< ""
	<< "layout(local_size_x = 1u, local_size_y = 1u, local_size_z = 1u) in;\n"
	<< "layout(set = 0, binding = 1u, std140) uniform BufferName\n"
	<< "{\n"
	<< "	highp vec4 colorA;\n"
	<< "	highp vec4 colorB;\n"
	<< "} b_instance;\n"
	<< "layout(set = 0, binding = 0, std140) writeonly buffer OutBuf\n"
	<< "{\n"
	<< "	highp vec4 read_colors[4];\n"
	<< "} b_out;\n"
	<< "void main(void)\n"
	<< "{\n"
	<< "	highp int quadrant_id = int(gl_WorkGroupID.x);\n"
	<< "	highp vec4 result_color;\n"
	<< "	if (quadrant_id == 1 || quadrant_id == 2)\n"
	<< "		result_color = b_instance.colorA;\n"
	<< "	else\n"
	<< "		result_color = b_instance.colorB;\n"
	<< "	b_out.read_colors[gl_WorkGroupID.x] = result_color;\n"
	<< "}\n";

	programCollection.glslSources.add("compute_good") << glu::ComputeSource(bufGood.str());

	std::ostringstream	bufBad;

	bufBad	<< versionDecl << "\n"
	<< ""
	<< "layout(local_size_x = 1u, local_size_y = 1u, local_size_z = 1u) in;\n"
	<< "layout(set = 0, binding = 1u, std140) uniform BufferName\n"
	<< "{\n"
	<< "	highp vec4 colorA;\n"
	<< "	highp vec4 colorB;\n"
	<< "} b_instance;\n"
	<< "layout(set = 0, binding = 0, std140) writeonly buffer OutBuf\n"
	<< "{\n"
	<< "	highp vec4 read_colors[4];\n"
	<< "} b_out;\n"
	<< "void main(void)\n"
	<< "{\n"
	<< "	highp int quadrant_id = int(gl_WorkGroupID.x);\n"
	<< "	highp vec4 result_color;\n"
	<< "	if (quadrant_id == 1 || quadrant_id == 2)\n"
	<< "		result_color = b_instance.colorA;\n"
	<< "	else\n"
	<< "		result_color = b_instance.colorB;\n"
	<< "	b_out.read_colors[gl_WorkGroupID.x] = vec4(0.0, 0.0, 0.0, 0.0);\n"
	<< "}\n";

	programCollection.glslSources.add("compute_bad") << glu::ComputeSource(bufBad.str());
}